

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMpsFF.cpp
# Opt level: O0

Parsekey __thiscall
free_format_parser::HMpsFF::parseBounds(HMpsFF *this,HighsLogOptions *log_options,istream *file)

{
  HMpsFF *pHVar1;
  bool bVar2;
  undefined8 uVar3;
  reference pvVar4;
  reference pvVar5;
  HMpsFF *in_RSI;
  long in_RDI;
  reference rVar6;
  reference rVar7;
  reference rVar8;
  double dl;
  HighsInt i_value;
  double value;
  bool is_nan;
  HighsInt colidx;
  size_t end_marker;
  string marker;
  size_t end_bound_name;
  string bound_name;
  string bound_type;
  bool is_defaultbound;
  bool is_semi;
  bool is_integral;
  bool is_ub;
  bool is_lb;
  Parsekey key;
  string word_1;
  size_t end;
  size_t begin;
  size_t report_fractional_integer_bound_frequency;
  size_t num_fractional_integer_bound;
  size_t report_ignored_duplicate_bound_frequency;
  size_t num_ignored_duplicate_bound;
  bool skip;
  vector<bool,_std::allocator<bool>_> has_upper;
  vector<bool,_std::allocator<bool>_> has_lower;
  HighsInt num_sc;
  HighsInt num_si;
  HighsInt num_ui;
  HighsInt num_li;
  HighsInt num_bv;
  HighsInt num_pl;
  HighsInt num_mi;
  string word;
  string strline;
  undefined4 in_stack_fffffffffffffbc8;
  int in_stack_fffffffffffffbcc;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffbd0;
  _Bit_type *in_stack_fffffffffffffbd8;
  HMpsFF *in_stack_fffffffffffffbe0;
  _Bit_type in_stack_fffffffffffffbe8;
  _Bit_type *in_stack_fffffffffffffbf0;
  _Bit_type *in_stack_fffffffffffffc08;
  HMpsFF *in_stack_fffffffffffffc10;
  HMpsFF *in_stack_fffffffffffffc18;
  HMpsFF *in_stack_fffffffffffffc20;
  HMpsFF *in_stack_fffffffffffffc28;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffc30;
  string *in_stack_fffffffffffffc40;
  string *in_stack_fffffffffffffc48;
  char *local_368;
  bool local_33a;
  bool local_339;
  HighsInt in_stack_fffffffffffffcd8;
  HighsInt in_stack_fffffffffffffcdc;
  string *in_stack_fffffffffffffce0;
  HMpsFF *in_stack_fffffffffffffce8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  in_stack_fffffffffffffcf0;
  HMpsFF *in_stack_fffffffffffffcf8;
  bool local_2e9;
  reference local_2c8;
  reference local_2b8;
  _Bit_reference local_2a8;
  double local_298;
  int local_28c;
  HMpsFF *local_288;
  byte local_279;
  string local_278 [32];
  reference local_258;
  reference local_248;
  reference local_238;
  reference local_228;
  reference local_218;
  reference local_208;
  HighsInt local_1f4;
  string local_1f0 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_1d0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_1c8;
  HMpsFF *local_1c0;
  string local_1b8 [32];
  HMpsFF *local_198;
  string local_190 [32];
  string local_170 [39];
  byte local_149;
  byte local_148;
  byte local_147;
  byte local_146;
  byte local_145;
  Parsekey local_144;
  string local_140 [32];
  string *local_120;
  undefined8 local_118;
  int local_10c;
  ulong local_108;
  ulong local_100;
  ulong local_f8;
  ulong local_f0;
  byte local_e6;
  undefined1 local_e5;
  undefined1 local_d1;
  uint local_7c;
  uint local_78;
  uint local_74;
  uint local_70;
  uint local_6c;
  uint local_68;
  uint local_64;
  string local_60 [32];
  string local_40 [40];
  HMpsFF *local_18;
  Parsekey local_4;
  
  local_18 = in_RSI;
  std::__cxx11::string::string(local_40);
  std::__cxx11::string::string(local_60);
  local_64 = 0;
  local_68 = 0;
  local_6c = 0;
  local_70 = 0;
  local_74 = 0;
  local_78 = 0;
  local_7c = 0;
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)0x46116b);
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)0x461178);
  local_d1 = 0;
  std::vector<bool,_std::allocator<bool>_>::assign
            (in_stack_fffffffffffffbd0,CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8)
             ,(bool *)0x4611a1);
  local_e5 = 0;
  std::vector<bool,_std::allocator<bool>_>::assign
            (in_stack_fffffffffffffbd0,CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8)
             ,(bool *)0x4611cc);
  rVar8._M_mask = in_stack_fffffffffffffbe8;
  rVar8._M_p = in_stack_fffffffffffffbf0;
  rVar7._M_mask = (_Bit_type)in_stack_fffffffffffffbd0;
  rVar7._M_p = in_stack_fffffffffffffbd8;
  local_f0 = 0;
  local_f8 = 1;
  local_100 = 0;
  local_108 = 1;
  while( true ) {
    do {
      bVar2 = getMpsLine((HMpsFF *)rVar8._M_mask,(istream *)in_stack_fffffffffffffbe0,
                         (string *)rVar7._M_p,(bool *)rVar7._M_mask);
      if (!bVar2) {
        local_4 = kFail;
        local_10c = 1;
        goto LAB_00462577;
      }
    } while ((local_e6 & 1) != 0);
    bVar2 = timeout((HMpsFF *)rVar7._M_mask);
    if (bVar2) break;
    local_118 = 0;
    local_120 = (string *)0x0;
    std::__cxx11::string::string(local_140);
    local_144 = checkFirstWord(in_stack_fffffffffffffcf8,(string *)in_stack_fffffffffffffcf0._M_cur,
                               (size_t *)in_stack_fffffffffffffce8,
                               (size_t *)in_stack_fffffffffffffce0,
                               (string *)
                               CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
    if (local_144 == kNone) {
      local_145 = 0;
      local_146 = 0;
      local_147 = 0;
      local_148 = 0;
      local_149 = 0;
      std::__cxx11::string::string(local_170,local_140);
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              rVar7._M_mask,
                              (char *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8))
      ;
      if (bVar2) {
        local_146 = 1;
LAB_00461945:
        first_word(in_stack_fffffffffffffc48,(size_t)in_stack_fffffffffffffc40);
        in_stack_fffffffffffffcf8 =
             (HMpsFF *)
             first_word_end((string *)in_stack_fffffffffffffc28,(size_t)in_stack_fffffffffffffc20);
        local_198 = in_stack_fffffffffffffcf8;
        std::__cxx11::string::string(local_1b8);
        in_stack_fffffffffffffcf0._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
                    (key_type *)0x4619bc);
        local_1c8._M_cur = in_stack_fffffffffffffcf0._M_cur;
        local_1d0._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
        bVar2 = std::__detail::operator!=(&local_1c8,&local_1d0);
        if (bVar2) {
          std::__cxx11::string::operator=(local_1b8,local_190);
          local_1c0 = local_198;
        }
        else {
          first_word(in_stack_fffffffffffffc48,(size_t)in_stack_fffffffffffffc40);
          in_stack_fffffffffffffce0 = local_1f0;
          std::__cxx11::string::operator=(local_1b8,in_stack_fffffffffffffce0);
          std::__cxx11::string::~string(in_stack_fffffffffffffce0);
          in_stack_fffffffffffffce8 =
               (HMpsFF *)
               first_word_end((string *)in_stack_fffffffffffffc28,(size_t)in_stack_fffffffffffffc20)
          ;
          local_1c0 = in_stack_fffffffffffffce8;
        }
        in_stack_fffffffffffffcdc =
             getColIdx(in_stack_fffffffffffffc18,(string *)in_stack_fffffffffffffc10,
                       SUB81((ulong)in_stack_fffffffffffffc08 >> 0x38,0));
        local_1f4 = in_stack_fffffffffffffcdc;
        if (in_stack_fffffffffffffcdc < 0) {
          in_stack_fffffffffffffcd8 =
               getColIdx(in_stack_fffffffffffffc18,(string *)in_stack_fffffffffffffc10,
                         SUB81((ulong)in_stack_fffffffffffffc08 >> 0x38,0));
          local_1f4 = in_stack_fffffffffffffcd8;
          std::vector<bool,_std::allocator<bool>_>::push_back
                    (in_stack_fffffffffffffc30,SUB81((ulong)in_stack_fffffffffffffc28 >> 0x38,0));
          std::vector<bool,_std::allocator<bool>_>::push_back
                    (in_stack_fffffffffffffc30,SUB81((ulong)in_stack_fffffffffffffc28 >> 0x38,0));
        }
        if ((local_145 & 1) == 0) {
LAB_00461beb:
          local_33a = false;
          if ((local_146 & 1) != 0) {
            rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[]
                              ((vector<bool,_std::allocator<bool>_> *)rVar8._M_p,rVar8._M_mask);
            local_218 = rVar6;
            local_33a = std::_Bit_reference::operator_cast_to_bool(&local_218);
          }
          local_339 = local_33a;
        }
        else {
          rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[]
                            ((vector<bool,_std::allocator<bool>_> *)rVar8._M_p,rVar8._M_mask);
          local_208 = rVar6;
          bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_208);
          local_339 = true;
          if (!bVar2) goto LAB_00461beb;
        }
        pHVar1 = local_18;
        if (local_339 == false) {
          if ((local_149 & 1) == 0) {
            std::__cxx11::string::operator=(local_140,"");
            first_word(in_stack_fffffffffffffc48,(size_t)in_stack_fffffffffffffc40);
            in_stack_fffffffffffffc40 = local_278;
            std::__cxx11::string::operator=(local_140,in_stack_fffffffffffffc40);
            std::__cxx11::string::~string(in_stack_fffffffffffffc40);
            in_stack_fffffffffffffc48 =
                 (string *)
                 first_word_end((string *)in_stack_fffffffffffffc28,
                                (size_t)in_stack_fffffffffffffc20);
            local_120 = in_stack_fffffffffffffc48;
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)rVar7._M_mask,
                                    (char *)CONCAT44(in_stack_fffffffffffffbcc,
                                                     in_stack_fffffffffffffbc8));
            if (bVar2) {
              trim((string *)rVar7._M_mask,
                   (string *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
              in_stack_fffffffffffffc28 = local_18;
              in_stack_fffffffffffffc30 =
                   (vector<bool,_std::allocator<bool>_> *)std::__cxx11::string::c_str();
              uVar3 = std::__cxx11::string::c_str();
              highsLogUser((HighsLogOptions *)in_stack_fffffffffffffc28,kError,
                           "No bound given for %s row \"%s\"\n",in_stack_fffffffffffffc30,uVar3);
              local_4 = kFail;
              local_10c = 1;
            }
            else {
              local_279 = 0;
              in_stack_fffffffffffffc20 =
                   (HMpsFF *)
                   getValue(in_stack_fffffffffffffc20,(string *)in_stack_fffffffffffffc18,
                            (bool *)in_stack_fffffffffffffc10,
                            (HighsInt)((ulong)in_stack_fffffffffffffc08 >> 0x20));
              local_288 = in_stack_fffffffffffffc20;
              if ((local_279 & 1) == 0) {
                if ((local_147 & 1) == 0) {
                  if ((local_148 & 1) != 0) {
                    pvVar4 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator[]
                                       ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)
                                        (in_RDI + 0x148),(long)local_1f4);
                    *pvVar4 = kSemiContinuous;
                  }
                }
                else {
                  local_28c = (int)(double)in_stack_fffffffffffffc20;
                  local_298 = (double)in_stack_fffffffffffffc20 - (double)local_28c;
                  if (((local_298 != 0.0) || (NAN(local_298))) &&
                     (local_100 = local_100 + 1, local_100 % local_108 == 0)) {
                    in_stack_fffffffffffffc10 = local_18;
                    uVar3 = std::__cxx11::string::c_str();
                    highsLogUser((HighsLogOptions *)local_288,
                                 (HighsLogType)in_stack_fffffffffffffc10,(char *)0x4,
                                 "Bound for LI/UI/SI column \"%s\" is %g: not integer\n",uVar3);
                    local_108 = local_108 << 1;
                  }
                  if ((local_148 & 1) == 0) {
                    pvVar4 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator[]
                                       ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)
                                        (in_RDI + 0x148),(long)local_1f4);
                    *pvVar4 = kInteger;
                  }
                  else {
                    pvVar4 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator[]
                                       ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)
                                        (in_RDI + 0x148),(long)local_1f4);
                    *pvVar4 = kSemiInteger;
                  }
                }
                pHVar1 = local_288;
                if ((local_145 & 1) != 0) {
                  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xb8),
                                      (long)local_1f4);
                  *pvVar5 = (value_type)pHVar1;
                  rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                    ((vector<bool,_std::allocator<bool>_> *)rVar8._M_p,rVar8._M_mask
                                    );
                  local_2a8._M_mask = rVar7._M_mask;
                  in_stack_fffffffffffffc08 = rVar7._M_p;
                  local_2a8._M_p = in_stack_fffffffffffffc08;
                  std::_Bit_reference::operator=(&local_2a8,true);
                }
                if ((local_146 & 1) != 0) {
                  in_stack_fffffffffffffbe0 = local_288;
                  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xd0),
                                      (long)local_1f4);
                  *pvVar5 = (value_type)in_stack_fffffffffffffbe0;
                  rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                    ((vector<bool,_std::allocator<bool>_> *)rVar8._M_p,rVar8._M_mask
                                    );
                  local_2b8 = rVar8;
                  std::_Bit_reference::operator=(&local_2b8,true);
                }
                rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                  ((vector<bool,_std::allocator<bool>_> *)rVar8._M_p,rVar8._M_mask);
                local_2c8 = rVar7;
                std::_Bit_reference::operator=(&local_2c8,false);
                local_10c = 0;
              }
              else {
                in_stack_fffffffffffffc18 = local_18;
                uVar3 = std::__cxx11::string::c_str();
                highsLogUser((HighsLogOptions *)in_stack_fffffffffffffc18,kError,
                             "Bound for column \"%s\" is NaN\n",uVar3);
                local_4 = kFail;
                local_10c = 1;
              }
            }
          }
          else {
            if ((local_147 & 1) == 0) {
              rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                ((vector<bool,_std::allocator<bool>_> *)rVar8._M_p,rVar8._M_mask);
              local_238 = rVar6;
              std::_Bit_reference::operator=(&local_238,false);
              if ((local_145 & 1) != 0) {
                pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                   ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xb8),
                                    (long)local_1f4);
                *pvVar5 = -INFINITY;
              }
              if ((local_146 & 1) != 0) {
                pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                   ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xd0),
                                    (long)local_1f4);
                *pvVar5 = INFINITY;
              }
            }
            else {
              if (((local_145 & 1) == 0) || ((local_146 & 1) == 0)) {
                trim((string *)rVar7._M_mask,
                     (string *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
                pHVar1 = local_18;
                uVar3 = std::__cxx11::string::c_str();
                highsLogUser((HighsLogOptions *)pHVar1,kError,
                             "BV row %s but [is_lb, is_ub] = [%1d, %1d]\n",uVar3,
                             (ulong)(local_145 & 1),(ulong)(local_146 & 1));
                local_4 = kFail;
                local_10c = 1;
                goto LAB_004624df;
              }
              pvVar4 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator[]
                                 ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)
                                  (in_RDI + 0x148),(long)local_1f4);
              *pvVar4 = kInteger;
              rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                ((vector<bool,_std::allocator<bool>_> *)rVar8._M_p,rVar8._M_mask);
              local_228 = rVar6;
              std::_Bit_reference::operator=(&local_228,true);
              pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xd0),
                                  (long)local_1f4);
              *pvVar5 = 1.0;
            }
            if ((local_145 & 1) != 0) {
              rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                ((vector<bool,_std::allocator<bool>_> *)rVar8._M_p,rVar8._M_mask);
              local_248 = rVar6;
              std::_Bit_reference::operator=(&local_248,true);
            }
            if ((local_146 & 1) != 0) {
              rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                ((vector<bool,_std::allocator<bool>_> *)rVar8._M_p,rVar8._M_mask);
              local_258 = rVar6;
              std::_Bit_reference::operator=(&local_258,true);
            }
            local_10c = 2;
          }
        }
        else {
          local_f0 = local_f0 + 1;
          if (local_f0 % local_f8 == 0) {
            uVar3 = std::__cxx11::string::c_str();
            if ((local_145 & 1) == 0) {
              local_368 = "BTRAN upper";
            }
            else {
              local_368 = "BTRAN lower";
            }
            local_368 = local_368 + 6;
            highsLogUser((HighsLogOptions *)pHVar1,kWarning,
                         "Column name \"%s\" in BOUNDS section has duplicate %s bound definition: ignored\n"
                         ,uVar3,local_368);
            local_f8 = local_f8 << 1;
          }
          local_10c = 2;
        }
LAB_004624df:
        std::__cxx11::string::~string(local_1b8);
        std::__cxx11::string::~string(local_190);
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )rVar7._M_mask,
                                (char *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8
                                                ));
        if (bVar2) {
          local_145 = 1;
          goto LAB_00461945;
        }
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )rVar7._M_mask,
                                (char *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8
                                                ));
        if (bVar2) {
          local_145 = 1;
          local_146 = 1;
          goto LAB_00461945;
        }
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )rVar7._M_mask,
                                (char *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8
                                                ));
        if (bVar2) {
          local_145 = 1;
          local_149 = 1;
          local_64 = local_64 + 1;
          goto LAB_00461945;
        }
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )rVar7._M_mask,
                                (char *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8
                                                ));
        if (bVar2) {
          local_146 = 1;
          local_149 = 1;
          local_68 = local_68 + 1;
          goto LAB_00461945;
        }
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )rVar7._M_mask,
                                (char *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8
                                                ));
        if (bVar2) {
          local_145 = 1;
          local_146 = 1;
          local_147 = 1;
          local_149 = 1;
          local_6c = local_6c + 1;
          goto LAB_00461945;
        }
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )rVar7._M_mask,
                                (char *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8
                                                ));
        if (bVar2) {
          local_145 = 1;
          local_147 = 1;
          local_70 = local_70 + 1;
          goto LAB_00461945;
        }
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )rVar7._M_mask,
                                (char *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8
                                                ));
        if (bVar2) {
          local_147 = 1;
          local_74 = local_74 + 1;
LAB_00461937:
          local_146 = 1;
          goto LAB_00461945;
        }
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )rVar7._M_mask,
                                (char *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8
                                                ));
        if (bVar2) {
          local_145 = 1;
          local_149 = 1;
          goto LAB_00461937;
        }
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )rVar7._M_mask,
                                (char *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8
                                                ));
        if (bVar2) {
          local_147 = 1;
          local_78 = local_78 + 1;
LAB_00461933:
          local_148 = 1;
          goto LAB_00461937;
        }
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )rVar7._M_mask,
                                (char *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8
                                                ));
        if (bVar2) {
          local_7c = local_7c + 1;
          goto LAB_00461933;
        }
        trim((string *)rVar7._M_mask,
             (string *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8));
        pHVar1 = local_18;
        uVar3 = std::__cxx11::string::c_str();
        highsLogUser((HighsLogOptions *)pHVar1,kError,
                     "Entry in BOUNDS section of MPS file is of type \"%s\"\n",uVar3);
        local_4 = kFail;
        local_10c = 1;
      }
      std::__cxx11::string::~string(local_170);
    }
    else {
      if (local_64 != 0) {
        highsLogUser((HighsLogOptions *)local_18,kInfo,
                     "Number of MI entries in BOUNDS section is %d\n",(ulong)local_64);
      }
      if (local_68 != 0) {
        highsLogUser((HighsLogOptions *)local_18,kInfo,
                     "Number of PL entries in BOUNDS section is %d\n",(ulong)local_68);
      }
      if (local_6c != 0) {
        highsLogUser((HighsLogOptions *)local_18,kInfo,
                     "Number of BV entries in BOUNDS section is %d\n",(ulong)local_6c);
      }
      if (local_70 != 0) {
        highsLogUser((HighsLogOptions *)local_18,kInfo,
                     "Number of LI entries in BOUNDS section is %d\n",(ulong)local_70);
      }
      if (local_74 != 0) {
        highsLogUser((HighsLogOptions *)local_18,kInfo,
                     "Number of UI entries in BOUNDS section is %d\n",(ulong)local_74);
      }
      if (local_78 != 0) {
        highsLogUser((HighsLogOptions *)local_18,kInfo,
                     "Number of SI entries in BOUNDS section is %d\n",(ulong)local_78);
      }
      if (local_7c != 0) {
        highsLogUser((HighsLogOptions *)local_18,kInfo,
                     "Number of SC entries in BOUNDS section is %d\n",(ulong)local_7c);
      }
      local_2e9 = local_f0 != 0 || local_100 != 0;
      *(bool *)(in_RDI + 8) = local_2e9;
      if ((*(byte *)(in_RDI + 8) & 1) != 0) {
        highsLogUser((HighsLogOptions *)local_18,kWarning,
                     "BOUNDS section: ignored %d duplicate values and %d fractional integer bounds\n"
                     ,local_f0 & 0xffffffff,local_100 & 0xffffffff);
      }
      highsLogDev((HighsLogOptions *)local_18,kInfo,"readMPS: Read BOUNDS  OK\n");
      local_4 = local_144;
      local_10c = 1;
    }
    std::__cxx11::string::~string(local_140);
    in_stack_fffffffffffffbcc = local_10c;
    if ((local_10c != 0) && (local_10c != 2)) {
LAB_00462577:
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)0x462584);
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)0x462591);
      std::__cxx11::string::~string(local_60);
      std::__cxx11::string::~string(local_40);
      return local_4;
    }
  }
  local_4 = kTimeout;
  local_10c = 1;
  goto LAB_00462577;
}

Assistant:

HMpsFF::Parsekey HMpsFF::parseBounds(const HighsLogOptions& log_options,
                                     std::istream& file) {
  std::string strline, word;

  HighsInt num_mi = 0;
  HighsInt num_pl = 0;
  HighsInt num_bv = 0;
  HighsInt num_li = 0;
  HighsInt num_ui = 0;
  HighsInt num_si = 0;
  HighsInt num_sc = 0;

  std::vector<bool> has_lower;
  std::vector<bool> has_upper;
  has_lower.assign(num_col, false);
  has_upper.assign(num_col, false);

  bool skip;
  size_t num_ignored_duplicate_bound = 0;
  size_t report_ignored_duplicate_bound_frequency = 1;
  size_t num_fractional_integer_bound = 0;
  size_t report_fractional_integer_bound_frequency = 1;
  while (getMpsLine(file, strline, skip)) {
    if (skip) continue;
    if (timeout()) return HMpsFF::Parsekey::kTimeout;

    size_t begin = 0;
    size_t end = 0;
    std::string word;
    HMpsFF::Parsekey key = checkFirstWord(strline, begin, end, word);

    // start of new section?
    if (key != Parsekey::kNone) {
      if (num_mi)
        highsLogUser(
            log_options, HighsLogType::kInfo,
            "Number of MI entries in BOUNDS section is %" HIGHSINT_FORMAT "\n",
            num_mi);
      if (num_pl)
        highsLogUser(
            log_options, HighsLogType::kInfo,
            "Number of PL entries in BOUNDS section is %" HIGHSINT_FORMAT "\n",
            num_pl);
      if (num_bv)
        highsLogUser(
            log_options, HighsLogType::kInfo,
            "Number of BV entries in BOUNDS section is %" HIGHSINT_FORMAT "\n",
            num_bv);
      if (num_li)
        highsLogUser(
            log_options, HighsLogType::kInfo,
            "Number of LI entries in BOUNDS section is %" HIGHSINT_FORMAT "\n",
            num_li);
      if (num_ui)
        highsLogUser(
            log_options, HighsLogType::kInfo,
            "Number of UI entries in BOUNDS section is %" HIGHSINT_FORMAT "\n",
            num_ui);
      if (num_si)
        highsLogUser(
            log_options, HighsLogType::kInfo,
            "Number of SI entries in BOUNDS section is %" HIGHSINT_FORMAT "\n",
            num_si);
      if (num_sc)
        highsLogUser(
            log_options, HighsLogType::kInfo,
            "Number of SC entries in BOUNDS section is %" HIGHSINT_FORMAT "\n",
            num_sc);
      warning_issued_ =
          num_ignored_duplicate_bound || num_fractional_integer_bound > 0;
      if (warning_issued_)
        highsLogUser(log_options, HighsLogType::kWarning,
                     "BOUNDS section: ignored %d duplicate values and %d "
                     "fractional integer bounds\n",
                     int(num_ignored_duplicate_bound),
                     int(num_fractional_integer_bound));
      highsLogDev(log_options, HighsLogType::kInfo,
                  "readMPS: Read BOUNDS  OK\n");
      return key;
    }
    bool is_lb = false;
    bool is_ub = false;
    bool is_integral = false;
    bool is_semi = false;
    bool is_defaultbound = false;
    const std::string bound_type = word;
    if (word == "UP")  // lower bound
      is_ub = true;
    else if (word == "LO")  // upper bound
      is_lb = true;
    else if (word == "FX")  // fixed
    {
      is_lb = true;
      is_ub = true;
    } else if (word == "MI")  // infinite lower bound
    {
      is_lb = true;
      is_defaultbound = true;
      num_mi++;
    } else if (word == "PL")  // infinite upper bound (redundant)
    {
      is_ub = true;
      is_defaultbound = true;
      num_pl++;
    } else if (word == "BV")  // binary
    {
      is_lb = true;
      is_ub = true;
      is_integral = true;
      is_defaultbound = true;
      num_bv++;
    } else if (word == "LI")  // integer lower bound
    {
      is_lb = true;
      is_integral = true;
      num_li++;
    } else if (word == "UI")  // integer upper bound
    {
      is_ub = true;
      is_integral = true;
      num_ui++;
    } else if (word == "FR")  // free variable
    {
      is_lb = true;
      is_ub = true;
      is_defaultbound = true;
    } else if (word == "SI")  // semi-integer variable
    {
      is_ub = true;
      is_integral = true;
      is_semi = true;
      num_si++;
    } else if (word == "SC")  // semi-continuous variable
    {
      is_ub = true;
      is_semi = true;
      num_sc++;
    } else {
      trim(word);
      highsLogUser(log_options, HighsLogType::kError,
                   "Entry in BOUNDS section of MPS file is of type \"%s\"\n",
                   word.c_str());
      return HMpsFF::Parsekey::kFail;
    }

    std::string bound_name = first_word(strline, end);
    size_t end_bound_name = first_word_end(strline, end);

    std::string marker;
    size_t end_marker;
    if (colname2idx.find(bound_name) != colname2idx.end()) {
      // SIF format might not have the bound name, so skip
      // it here if we found the marker instead
      marker = bound_name;
      end_marker = end_bound_name;
    } else {
      // The first word is the bound name, which should be ignored.
      marker = first_word(strline, end_bound_name);
      end_marker = first_word_end(strline, end_bound_name);
    }

    // BOUNDS: get column index from name, without adding new column
    // if not existing yet
    HighsInt colidx = getColIdx(marker, false);
    if (colidx < 0) {
      // add new column if did not exist yet
      colidx = getColIdx(marker, true);
      assert(colidx == num_col - 1);
      has_lower.push_back(false);
      has_upper.push_back(false);
    }

    // Determine whether this entry yields a duplicate bound
    // definition
    if ((is_lb && has_lower[colidx]) || (is_ub && has_upper[colidx])) {
      num_ignored_duplicate_bound++;
      if (num_ignored_duplicate_bound %
              report_ignored_duplicate_bound_frequency ==
          0) {
        highsLogUser(
            log_options, HighsLogType::kWarning,
            "Column name \"%s\" in BOUNDS section has duplicate %s bound "
            "definition: ignored\n",
            marker.c_str(), is_lb ? "lower" : "upper");
        report_ignored_duplicate_bound_frequency *= 2;
      }
      continue;
    }

    if (is_defaultbound) {
      // MI, PL, BV or FR
      if (is_integral)
      // binary: BV
      {
        if (!is_lb || !is_ub) {
          trim(marker);
          highsLogUser(log_options, HighsLogType::kError,
                       "BV row %s but [is_lb, is_ub] = [%1" HIGHSINT_FORMAT
                       ", %1" HIGHSINT_FORMAT "]\n",
                       marker.c_str(), is_lb, is_ub);
          assert(is_lb && is_ub);
          return HMpsFF::Parsekey::kFail;
        }
        assert(is_lb && is_ub);
        // Mark the column as integer and binary
        col_integrality[colidx] = HighsVarType::kInteger;
        col_binary[colidx] = true;
        assert(col_lower[colidx] == 0.0);
        col_upper[colidx] = 1.0;
      } else {
        // continuous: MI, PL or FR
        col_binary[colidx] = false;
        if (is_lb) col_lower[colidx] = -kHighsInf;
        if (is_ub) col_upper[colidx] = kHighsInf;
      }
      if (is_lb) has_lower[colidx] = true;
      if (is_ub) has_upper[colidx] = true;
      continue;
    }
    // Bounds now are UP, LO, FX, LI, UI, SI or SC
    // here marker is the col name and end marks its end
    word = "";
    word = first_word(strline, end_marker);
    end = first_word_end(strline, end_marker);

    if (word == "") {
      trim(marker);
      highsLogUser(log_options, HighsLogType::kError,
                   "No bound given for %s row \"%s\"\n", bound_type.c_str(),
                   marker.c_str());
      return HMpsFF::Parsekey::kFail;
    }
    bool is_nan = false;
    double value = getValue(word, is_nan);  // atof(word.c_str());
    if (is_nan) {
      highsLogUser(log_options, HighsLogType::kError,
                   "Bound for column \"%s\" is NaN\n", marker.c_str());
      return HMpsFF::Parsekey::kFail;
    }
    if (is_integral) {
      assert(is_lb || is_ub || is_semi);
      // Must be LI, UI or SI, and value should be integer
      HighsInt i_value = static_cast<HighsInt>(value);
      double dl = value - i_value;
      if (dl) {
        num_fractional_integer_bound++;
        if (num_fractional_integer_bound %
                report_fractional_integer_bound_frequency ==
            0) {
          highsLogUser(log_options, HighsLogType::kWarning,
                       "Bound for LI/UI/SI column \"%s\" is %g: not integer\n",
                       marker.c_str(), value);
          report_fractional_integer_bound_frequency *= 2;
        }
      }
      if (is_semi) {
        // Bound marker SI defines the column as semi-integer
        col_integrality[colidx] = HighsVarType::kSemiInteger;
      } else {
        // Bound marker LI or UI defines the column as integer
        col_integrality[colidx] = HighsVarType::kInteger;
      }
    } else if (is_semi) {
      // Bound marker SC defines the column as semi-continuous
      col_integrality[colidx] = HighsVarType::kSemiContinuous;
    }
    // Assign the bounds that have been read
    if (is_lb) {
      col_lower[colidx] = value;
      has_lower[colidx] = true;
    }
    if (is_ub) {
      col_upper[colidx] = value;
      has_upper[colidx] = true;
    }
    // Column is not binary by default
    col_binary[colidx] = false;
  }
  return Parsekey::kFail;
}